

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

uint64_t HashFile(string *filename,bool one_block)

{
  int iVar1;
  long lVar2;
  void *__s;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000031;
  uint64_t uVar8;
  ifstream f;
  Logger local_280;
  undefined4 local_27c;
  string local_278;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_27c = (undefined4)CONCAT71(in_register_00000031,one_block);
  std::ifstream::ifstream(local_238,(string *)filename,_S_bin|_S_ate);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 1) == 0) {
    lVar2 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    iVar1 = std::istream::tellg();
    if (iVar1 != 0) {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_280.severity_ = ERR;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,"");
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"HashFile","");
      poVar4 = Logger::Start(ERR,&local_258,0x14d,&local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_EQ failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x14d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"static_cast<int>(f.tellg())",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      iVar1 = std::istream::tellg();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      Logger::~Logger(&local_280);
      abort();
    }
    uVar8 = 0x160f7;
    lVar7 = 0;
    do {
      if (lVar2 <= lVar7) break;
      lVar6 = lVar7 + 0xfa000;
      if (lVar2 < lVar7 + 0xfa000) {
        lVar6 = lVar2;
      }
      __s = operator_new(0xfa000);
      lVar7 = lVar6 - lVar7;
      memset(__s,0,0xfa000);
      std::istream::read((char *)local_238,(long)__s);
      if (lVar7 < 9) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        do {
          lVar5 = *(long *)((long)__s + uVar3);
          uVar3 = uVar3 + 8;
          uVar8 = ((lVar5 + 1 + uVar8) * (lVar5 + uVar8) >> 1) + lVar5;
        } while ((long)uVar3 < lVar7 + -8);
        uVar3 = uVar3 & 0xffffffff;
      }
      for (; (long)uVar3 < lVar7; uVar3 = uVar3 + 1) {
        lVar5 = (long)*(char *)((long)__s + uVar3);
        uVar8 = ((uVar8 + lVar5) * (uVar8 + 1 + lVar5) >> 1) + lVar5;
      }
      operator_delete(__s);
      lVar7 = lVar6;
    } while ((char)local_27c == '\0');
  }
  else {
    uVar8 = 0;
  }
  std::ifstream::~ifstream(local_238);
  return uVar8;
}

Assistant:

inline uint64_t HashFile(const std::string &filename, bool one_block=false) {
  std::ifstream f(filename, std::ios::ate | std::ios::binary);
  if (f.bad()) { return 0; }

  long end = (long) f.tellg();
  f.seekg(0, std::ios::beg);
  CHECK_EQ(static_cast<int>(f.tellg()), 0);

  uint64_t magic = 90359;
  for (long pos = 0; pos < end; ) {
#ifndef _MSC_VER
    long next_pos = std::min(pos + kChunkSize, end);
#else
    long next_pos = __min(pos + kChunkSize, end);
#endif
    long size = next_pos - pos;
    std::vector<char> buffer(kChunkSize);
    f.read(buffer.data(), size);

    int i = 0;
    while (i < size - 8) {
      uint64_t x = *reinterpret_cast<uint64_t *>(buffer.data() + i);
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
      i += 8;
    }
    for ( ; i < size; i++) {
      char x = buffer[i];
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
    }

    pos = next_pos;
    if (one_block) { break; }
  }

  return magic;
}